

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
          (buffer_appender<char> out,unsigned_long value,basic_format_specs<char> *specs)

{
  iterator it;
  int value_00;
  buffer_appender<char> it_00;
  long in_RDX;
  anon_class_16_2_92d121e5 *in_RSI;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_RDI;
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  anon_class_16_2_92d121e5 *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  basic_format_specs<char> *in_stack_ffffffffffffffb0;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 local_8;
  
  value_00 = count_digits<4u,unsigned_long>((unsigned_long)in_RSI);
  to_unsigned<int>(value_00);
  if (in_RDX == 0) {
    reserve<char>((buffer_appender<char>)in_stack_ffffffffffffffb8.container,
                  (size_t)in_RDI.container);
    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         in_stack_ffffffffffffffcc;
    it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ = value_00;
    it_00 = write_ptr<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long>::
            anon_class_16_2_92d121e5::operator()(in_RSI,it);
    local_8 = (buffer<char> *)
              base_iterator<fmt::v7::detail::buffer_appender<char>>(in_RDI.container,it_00);
  }
  else {
    local_8 = (buffer<char> *)
              write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>(fmt::v7::detail::buffer_appender<char>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_&>
                        (in_RDI.container,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
  }
  return (buffer_appender<char>)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}